

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O2

void __thiscall Clasp::Cli::ClaspAppBase::run(ClaspAppBase *this)

{
  int iVar1;
  int iVar2;
  uintp uVar3;
  Span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> SVar4;
  
  uVar3 = (this->out_).ptr_;
  if (1 < uVar3) {
    if ((this->claspAppOpts_).input.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->claspAppOpts_).input.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      SVar4.size = 1;
      SVar4.first = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    stdinStr_abi_cxx11_;
    }
    else {
      SVar4 = Potassco::
              toSpan<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (&(this->claspAppOpts_).input);
      uVar3 = (this->out_).ptr_;
    }
    iVar1 = (**(this->super_Application)._vptr_Application)(this);
    iVar2 = (*(this->super_Application)._vptr_Application[1])(this);
    (**(code **)(*(long *)(uVar3 & 0xfffffffffffffffe) + 0x28))
              ((long *)(uVar3 & 0xfffffffffffffffe),iVar1,iVar2,SVar4.first,SVar4.first + SVar4.size
              );
  }
  (*(this->super_Application)._vptr_Application[0x16])
            (this,(this->clasp_).ptr_ & 0xfffffffffffffffe);
  return;
}

Assistant:

void ClaspAppBase::run() {
	if (out_.get()) {
		Potassco::Span<std::string> in = !claspAppOpts_.input.empty() ? Potassco::toSpan(claspAppOpts_.input) : Potassco::toSpan(&stdinStr, 1);
		out_->run(getName(), getVersion(), Potassco::begin(in), Potassco::end(in));
	}
	try        { run(*clasp_); }
	catch(...) {
		try { blockSignals(); setExitCode(E_ERROR); throw; }
		catch (const std::bad_alloc&  ) { setExitCode(E_MEMORY); error("std::bad_alloc"); }
		catch (const std::exception& e) { error(e.what()); }
		catch (...)                     { ; }
	}
}